

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O0

void __thiscall
cmTcpIpConnection::cmTcpIpConnection
          (cmTcpIpConnection *this,int port,cmConnectionBufferStrategy *bufferStrategy)

{
  cmConnectionBufferStrategy *bufferStrategy_local;
  int port_local;
  cmTcpIpConnection *this_local;
  
  cmEventBasedConnection::cmEventBasedConnection(&this->super_cmEventBasedConnection,bufferStrategy)
  ;
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_00da6f08;
  this->Port = port;
  auto_tcp_t::auto_tcp_t(&this->ServerHandle);
  auto_tcp_t::auto_tcp_t(&this->ClientHandle);
  return;
}

Assistant:

cmTcpIpConnection::cmTcpIpConnection(
  int port, cmConnectionBufferStrategy* bufferStrategy)
  : cmEventBasedConnection(bufferStrategy)
  , Port(port)
{
}